

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O3

void al_convert_mask_to_alpha(ALLEGRO_BITMAP *bitmap,ALLEGRO_COLOR mask_color)

{
  _Bool _Var1;
  ALLEGRO_LOCKED_REGION *pAVar2;
  int iVar3;
  int y;
  int iVar4;
  undefined1 auVar5 [16];
  ALLEGRO_COLOR color;
  ALLEGRO_COLOR AVar6;
  ALLEGRO_STATE state;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char local_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  char cStack_421;
  char cStack_420;
  char cStack_41f;
  char cStack_41e;
  char cStack_41d;
  char cStack_41c;
  char cStack_41b;
  char cStack_41a;
  char cStack_419;
  ALLEGRO_STATE local_418;
  
  pAVar2 = al_lock_bitmap(bitmap,0,0);
  if (pAVar2 == (ALLEGRO_LOCKED_REGION *)0x0) {
    _Var1 = _al_trace_prefix("bitmap",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
                             ,0x107,"al_convert_mask_to_alpha");
    if (_Var1) {
      _al_trace_suffix("Couldn\'t lock bitmap.");
      return;
    }
  }
  else {
    al_store_state(&local_418,8);
    al_set_target_bitmap(bitmap);
    y = 0;
    color = al_map_rgba('\0','\0','\0','\0');
    iVar4 = bitmap->h;
    if (0 < iVar4) {
      iVar3 = bitmap->w;
      do {
        if (0 < iVar3) {
          iVar4 = 0;
          do {
            AVar6 = al_get_pixel(bitmap,iVar4,y);
            local_438 = AVar6.r._0_1_;
            cStack_437 = AVar6.r._1_1_;
            cStack_436 = AVar6.r._2_1_;
            cStack_435 = AVar6.r._3_1_;
            cStack_434 = AVar6.g._0_1_;
            cStack_433 = AVar6.g._1_1_;
            cStack_432 = AVar6.g._2_1_;
            cStack_431 = AVar6.g._3_1_;
            cStack_430 = AVar6.b._0_1_;
            cStack_42f = AVar6.b._1_1_;
            cStack_42e = AVar6.b._2_1_;
            cStack_42d = AVar6.b._3_1_;
            cStack_42c = AVar6.a._0_1_;
            cStack_42b = AVar6.a._1_1_;
            cStack_42a = AVar6.a._2_1_;
            cStack_429 = AVar6.a._3_1_;
            local_428 = mask_color.r._0_1_;
            cStack_427 = mask_color.r._1_1_;
            cStack_426 = mask_color.r._2_1_;
            cStack_425 = mask_color.r._3_1_;
            cStack_424 = mask_color.g._0_1_;
            cStack_423 = mask_color.g._1_1_;
            cStack_422 = mask_color.g._2_1_;
            cStack_421 = mask_color.g._3_1_;
            cStack_420 = mask_color.b._0_1_;
            cStack_41f = mask_color.b._1_1_;
            cStack_41e = mask_color.b._2_1_;
            cStack_41d = mask_color.b._3_1_;
            cStack_41c = mask_color.a._0_1_;
            cStack_41b = mask_color.a._1_1_;
            cStack_41a = mask_color.a._2_1_;
            cStack_419 = mask_color.a._3_1_;
            auVar5[0] = -(local_428 == local_438);
            auVar5[1] = -(cStack_427 == cStack_437);
            auVar5[2] = -(cStack_426 == cStack_436);
            auVar5[3] = -(cStack_425 == cStack_435);
            auVar5[4] = -(cStack_424 == cStack_434);
            auVar5[5] = -(cStack_423 == cStack_433);
            auVar5[6] = -(cStack_422 == cStack_432);
            auVar5[7] = -(cStack_421 == cStack_431);
            auVar5[8] = -(cStack_420 == cStack_430);
            auVar5[9] = -(cStack_41f == cStack_42f);
            auVar5[10] = -(cStack_41e == cStack_42e);
            auVar5[0xb] = -(cStack_41d == cStack_42d);
            auVar5[0xc] = -(cStack_41c == cStack_42c);
            auVar5[0xd] = -(cStack_41b == cStack_42b);
            auVar5[0xe] = -(cStack_41a == cStack_42a);
            auVar5[0xf] = -(cStack_419 == cStack_429);
            if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
              al_put_pixel(iVar4,y,color);
            }
            iVar4 = iVar4 + 1;
            iVar3 = bitmap->w;
          } while (iVar4 < iVar3);
          iVar4 = bitmap->h;
        }
        y = y + 1;
      } while (y < iVar4);
    }
    al_unlock_bitmap(bitmap);
    al_restore_state(&local_418);
  }
  return;
}

Assistant:

void al_convert_mask_to_alpha(ALLEGRO_BITMAP *bitmap, ALLEGRO_COLOR mask_color)
{
   ALLEGRO_LOCKED_REGION *lr;
   int x, y;
   ALLEGRO_COLOR pixel;
   ALLEGRO_COLOR alpha_pixel;
   ALLEGRO_STATE state;

   if (!(lr = al_lock_bitmap(bitmap, ALLEGRO_PIXEL_FORMAT_ANY, 0))) {
      ALLEGRO_ERROR("Couldn't lock bitmap.");
      return;
   }

   al_store_state(&state, ALLEGRO_STATE_TARGET_BITMAP);
   al_set_target_bitmap(bitmap);

   alpha_pixel = al_map_rgba(0, 0, 0, 0);

   for (y = 0; y < bitmap->h; y++) {
      for (x = 0; x < bitmap->w; x++) {
         pixel = al_get_pixel(bitmap, x, y);
         if (memcmp(&pixel, &mask_color, sizeof(ALLEGRO_COLOR)) == 0) {
            al_put_pixel(x, y, alpha_pixel);
         }
      }
   }

   al_unlock_bitmap(bitmap);

   al_restore_state(&state);
}